

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScanMD.cpp
# Opt level: O0

StackSym * __thiscall
LinearScanMD::EnsureSpillSymForXmmReg(LinearScanMD *this,RegNum reg,Func *func,IRType type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *local_30;
  StackSym *sym;
  IRType type_local;
  Func *func_local;
  RegNum reg_local;
  LinearScanMD *this_local;
  
  if ((reg < RegXMM0) || (RegXMM15 < reg)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LinearScanMD.cpp"
                       ,0x3b,"(((reg) >= RegXMM0 && (reg) <= RegXMM15))","REGNUM_ISXMMXREG(reg)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (type == TyFloat32) {
    local_30 = this->xmmSymTable32[(int)(reg - 0x11)];
  }
  else if (type == TyFloat64) {
    local_30 = this->xmmSymTable64[(int)(reg - 0x11)];
  }
  else {
    bVar2 = IRType_IsSimd128(type);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LinearScanMD.cpp"
                         ,0x49,"(IRType_IsSimd128(type))","IRType_IsSimd128(type)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    local_30 = this->xmmSymTable128[(int)(reg - 0x11)];
  }
  if (local_30 == (StackSym *)0x0) {
    local_30 = StackSym::New(type,func);
    Func::StackAllocate(func,local_30,TySize[type]);
    if (type == TyFloat32) {
      this->xmmSymTable32[(int)(reg - 0x11)] = local_30;
    }
    else if (type == TyFloat64) {
      this->xmmSymTable64[(int)(reg - 0x11)] = local_30;
    }
    else {
      bVar2 = IRType_IsSimd128(type);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LinearScanMD.cpp"
                           ,0x5e,"(IRType_IsSimd128(type))","IRType_IsSimd128(type)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      this->xmmSymTable128[(int)(reg - 0x11)] = local_30;
    }
  }
  return local_30;
}

Assistant:

StackSym *
LinearScanMD::EnsureSpillSymForXmmReg(RegNum reg, Func *func, IRType type)
{
    Assert(REGNUM_ISXMMXREG(reg));

    __analysis_assume(reg - FIRST_XMM_REG < XMM_REGCOUNT);
    StackSym *sym;
    if (type == TyFloat32)
    {
        sym = this->xmmSymTable32[reg - FIRST_XMM_REG];
    }
    else if (type == TyFloat64)
    {
        sym = this->xmmSymTable64[reg - FIRST_XMM_REG];
    }
    else
    {
        Assert(IRType_IsSimd128(type));
        sym = this->xmmSymTable128[reg - FIRST_XMM_REG];
    }

    if (sym == nullptr)
    {
        sym = StackSym::New(type, func);
        func->StackAllocate(sym, TySize[type]);

        __analysis_assume(reg - FIRST_XMM_REG < XMM_REGCOUNT);

        if (type == TyFloat32)
        {
            this->xmmSymTable32[reg - FIRST_XMM_REG] = sym;
        }
        else if (type == TyFloat64)
        {
            this->xmmSymTable64[reg - FIRST_XMM_REG] = sym;
        }
        else
        {
            Assert(IRType_IsSimd128(type));
            this->xmmSymTable128[reg - FIRST_XMM_REG] = sym;
        }
    }

    return sym;
}